

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O0

bool doctest::operator<(Approx *lhs,double rhs)

{
  long in_RDI;
  Approx *in_XMM0_Qa;
  uint7 in_stack_ffffffffffffffe8;
  bool bVar1;
  
  bVar1 = false;
  if (*(double *)(in_RDI + 0x10) < (double)in_XMM0_Qa) {
    bVar1 = operator!=(in_XMM0_Qa,(double)(ulong)in_stack_ffffffffffffffe8);
  }
  return bVar1;
}

Assistant:

bool operator<(const Approx& lhs, double rhs) { return lhs.m_value < rhs && lhs != rhs; }